

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_new_collisions::test_method(addrman_new_collisions *this)

{
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  initializer_list<CAddress> __l_01;
  bool bVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  uint32_t collisions;
  uint32_t num_addrs;
  __single_object addrman;
  CService addr2;
  CService addr1;
  CService addr;
  CNetAddr source;
  char *in_stack_fffffffffffff708;
  CService *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff718;
  _Optional_payload_base<bool> _Var3;
  char *in_stack_fffffffffffff720;
  _Optional_payload_base<Network> in_stack_fffffffffffff728;
  CService *in_stack_fffffffffffff730;
  CAddress *in_stack_fffffffffffff738;
  const_string *in_stack_fffffffffffff740;
  NodeContext *in_stack_fffffffffffff748;
  iterator in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  undefined1 *local_848;
  undefined1 uVar4;
  uint16_t in_stack_fffffffffffff7f6;
  undefined1 *puVar5;
  undefined1 *local_730;
  undefined1 local_620 [8];
  undefined8 local_618;
  undefined1 local_610 [16];
  undefined1 local_600 [64];
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [4];
  assertion_result local_560 [2];
  undefined1 local_528 [8];
  undefined8 local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [64];
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [4];
  assertion_result local_468 [2];
  optional<bool> local_42a;
  size_t local_428;
  undefined1 local_420 [16];
  undefined1 local_410 [64];
  const_string local_3d0 [2];
  lazy_ostream local_3b0 [4];
  assertion_result local_370 [2];
  optional<bool> local_332;
  size_t local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [68];
  undefined1 local_2d4 [20];
  optional<Network> local_2c0;
  optional<Network> local_2b8;
  optional<Network> local_2b0;
  optional<Network> local_2a8 [6];
  undefined1 local_278 [56];
  undefined1 local_240 [144];
  undefined1 local_1b0 [56];
  undefined1 local_178 [144];
  undefined1 local_e8 [56];
  undefined1 local_b0 [168];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d4._8_4_ = GetCheckRatio(in_stack_fffffffffffff748);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738,
             (int *)in_stack_fffffffffffff730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,
             (allocator<char> *)in_stack_fffffffffffff748);
  ResolveIP(in_stack_fffffffffffff760);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708);
  std::allocator<char>::~allocator((allocator<char> *)(local_2d4 + 7));
  local_2d4._0_4_ = 0;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
               (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    _Var3 = SUB82((ulong)in_stack_fffffffffffff718 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
    std::optional<Network>::optional(local_2a8);
    std::optional<bool>::optional(&local_332);
    local_330 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff710,
                              (optional<Network>)in_stack_fffffffffffff728,(optional<bool>)_Var3);
    in_stack_fffffffffffff718 = "num_addrs";
    in_stack_fffffffffffff710 = (CService *)local_2d4;
    in_stack_fffffffffffff708 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_318,local_328,0x127,1,2,&local_330);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  while ((uint)local_2d4._0_4_ < 0x16) {
    local_2d4._0_4_ = local_2d4._0_4_ + 1;
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff740);
    std::operator+(in_stack_fffffffffffff720,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff718);
    ResolveService(in_stack_fffffffffffff758,in_stack_fffffffffffff7f6);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff708);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff708);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
                 (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
                 (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
                ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
      CService::CService((CService *)in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      CAddress::CAddress(in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                         (ServiceFlags)in_stack_fffffffffffff728);
      std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
      __l._M_len = (size_type)in_stack_fffffffffffff758;
      __l._M_array = in_stack_fffffffffffff750;
      std::vector<CAddress,_std::allocator<CAddress>_>::vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff748,__l,
                 (allocator_type *)in_stack_fffffffffffff740);
      s<(char)48>();
      AddrMan::Add((AddrMan *)in_stack_fffffffffffff718,
                   (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff710,
                   (CNetAddr *)in_stack_fffffffffffff708,(seconds)in_stack_fffffffffffff728);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff718,
                 SUB81((ulong)in_stack_fffffffffffff710 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
                 (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff710,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
                 (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
      in_stack_fffffffffffff708 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_370,local_3b0,local_3d0,299,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff708);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff708);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff718);
      std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
      local_730 = local_b0;
      do {
        local_730 = local_730 + -0x38;
        CAddress::~CAddress((CAddress *)in_stack_fffffffffffff708);
      } while (local_730 != local_e8);
      CService::~CService((CService *)in_stack_fffffffffffff708);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
                 (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
                 (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
                 (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
      _Var3 = SUB82((ulong)in_stack_fffffffffffff718 >> 0x30,0);
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
                ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
      std::optional<Network>::optional(&local_2b0);
      std::optional<bool>::optional(&local_42a);
      local_428 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff710,
                                (optional<Network>)in_stack_fffffffffffff728,(optional<bool>)_Var3);
      in_stack_fffffffffffff718 = "num_addrs";
      in_stack_fffffffffffff710 = (CService *)local_2d4;
      in_stack_fffffffffffff708 = "addrman->Size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_410,local_420,0x12e,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff708);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    CService::~CService((CService *)in_stack_fffffffffffff708);
  }
  local_2d4._0_4_ = local_2d4._0_4_ + 1;
  util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff740);
  std::operator+(in_stack_fffffffffffff720,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff718);
  ResolveService(in_stack_fffffffffffff758,in_stack_fffffffffffff7f6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
               (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
    CService::CService((CService *)in_stack_fffffffffffff718,in_stack_fffffffffffff710);
    CAddress::CAddress(in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                       (ServiceFlags)in_stack_fffffffffffff728);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
    __l_00._M_len = (size_type)in_stack_fffffffffffff758;
    __l_00._M_array = in_stack_fffffffffffff750;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff748,__l_00,
               (allocator_type *)in_stack_fffffffffffff740);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff718,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff710,
                 (CNetAddr *)in_stack_fffffffffffff708,(seconds)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff718,
               SUB81((ulong)in_stack_fffffffffffff710 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff710,
               (basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    in_stack_fffffffffffff708 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_468,local_4a8,local_4c8,0x134,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff708);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff708);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff718);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
    puVar5 = local_1b0;
    puVar2 = local_178;
    do {
      puVar2 = puVar2 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff708);
    } while (puVar2 != puVar5);
    CService::~CService((CService *)in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar4 = (undefined1)in_stack_fffffffffffff7f6;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
               (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    _Var3 = SUB82((ulong)in_stack_fffffffffffff718 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
    std::optional<Network>::optional(&local_2b8);
    std::optional<bool>::optional((optional<bool> *)(local_528 + 6));
    local_520 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff710,
                              (optional<Network>)in_stack_fffffffffffff728,(optional<bool>)_Var3);
    local_528._0_4_ = local_2d4._0_4_ + -1;
    in_stack_fffffffffffff718 = "num_addrs - collisions";
    in_stack_fffffffffffff710 = (CService *)local_528;
    in_stack_fffffffffffff708 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_508,local_518,0x135,1,2,&local_520);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff7f6 = CONCAT11(bVar1,uVar4);
  } while (bVar1);
  local_2d4._0_4_ = local_2d4._0_4_ + 1;
  util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff740);
  std::operator+(in_stack_fffffffffffff720,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff718);
  ResolveService(in_stack_fffffffffffff758,in_stack_fffffffffffff7f6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff708);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
               (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
    CService::CService((CService *)in_stack_fffffffffffff718,in_stack_fffffffffffff710);
    CAddress::CAddress(in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                       (ServiceFlags)in_stack_fffffffffffff728);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
    __l_01._M_len = (size_type)in_stack_fffffffffffff758;
    __l_01._M_array = in_stack_fffffffffffff750;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff748,__l_01,
               (allocator_type *)in_stack_fffffffffffff740);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff718,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff710,
                 (CNetAddr *)in_stack_fffffffffffff708,(seconds)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff718,
               SUB81((ulong)in_stack_fffffffffffff710 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff710,
               (basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    in_stack_fffffffffffff708 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_560,local_5a0,local_5c0,0x138,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff708);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff708);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff718);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff708);
    local_848 = local_240;
    do {
      local_848 = local_848 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff708);
    } while (local_848 != local_278);
    CService::~CService((CService *)in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff708);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff748,in_stack_fffffffffffff740,
               (size_t)in_stack_fffffffffffff738,(const_string *)in_stack_fffffffffffff730);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff710,(char (*) [1])in_stack_fffffffffffff708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718,
               (pointer)in_stack_fffffffffffff710,(unsigned_long)in_stack_fffffffffffff708);
    _Var3 = SUB82((ulong)in_stack_fffffffffffff718 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff708);
    std::optional<Network>::optional(&local_2c0);
    std::optional<bool>::optional((optional<bool> *)(local_620 + 6));
    local_618 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff710,
                              (optional<Network>)in_stack_fffffffffffff728,(optional<bool>)_Var3);
    local_620._0_4_ = local_2d4._0_4_ + -1;
    in_stack_fffffffffffff718 = "num_addrs - collisions";
    in_stack_fffffffffffff710 = (CService *)local_620;
    in_stack_fffffffffffff708 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_600,local_610,0x139,1,2,&local_618);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff708);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CService::~CService((CService *)in_stack_fffffffffffff708);
  CService::~CService((CService *)in_stack_fffffffffffff708);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff708);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff718);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_collisions)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    uint32_t num_addrs{0};

    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);

    while (num_addrs < 22) { // Magic number! 250.1.1.1 - 250.1.1.22 do not collide with deterministic key = 1
        CService addr = ResolveService("250.1.1." + ToString(++num_addrs));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // Test: No collision in new table yet.
        BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);
    }

    // Test: new table collision!
    CService addr1 = ResolveService("250.1.1." + ToString(++num_addrs));
    uint32_t collisions{1};
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);

    CService addr2 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);
}